

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWriterTests.cpp
# Opt level: O0

int testFileWriterTestsNoAccess(void)

{
  string *__lhs;
  ostream *poVar1;
  runtime_error *ex;
  FileWriter local_2a8;
  byte local_91;
  undefined1 local_90 [7];
  bool caughtCorrectException;
  undefined1 local_70 [8];
  AutoDeleteTempFile tmpDir;
  allocator<char> local_31;
  undefined1 local_30 [8];
  string fileName;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,"",&local_31);
  std::allocator<char>::~allocator(&local_31);
  MILBlob::TestUtil::AutoDeleteTempFile::AutoDeleteTempFile((AutoDeleteTempFile *)local_70,DIR);
  __lhs = MILBlob::TestUtil::AutoDeleteTempFile::GetFilename_abi_cxx11_
                    ((AutoDeleteTempFile *)local_70);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,__lhs
                 ,"/weight.wt");
  std::__cxx11::string::operator=((string *)local_30,(string *)local_90);
  std::__cxx11::string::~string((string *)local_90);
  MILBlob::TestUtil::AutoDeleteTempFile::~AutoDeleteTempFile((AutoDeleteTempFile *)local_70);
  local_91 = 0;
  MILBlob::Blob::FileWriter::FileWriter(&local_2a8,(string *)local_30,true);
  MILBlob::Blob::FileWriter::~FileWriter(&local_2a8);
  fileName.field_2._M_local_buf[0xc] = (local_91 & 1) == 0;
  if ((bool)fileName.field_2._M_local_buf[0xc]) {
    poVar1 = std::operator<<((ostream *)&std::clog,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/MILBlob/FileWriterTests.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x25);
    std::operator<<(poVar1,": expected exception, but none thrown.\n");
  }
  fileName.field_2._13_3_ = 0;
  std::__cxx11::string::~string((string *)local_30);
  return fileName.field_2._12_4_;
}

Assistant:

int testFileWriterTestsNoAccess()
{
    std::string fileName = "";
    {
        AutoDeleteTempFile tmpDir(AutoDeleteTempFile::FileType::DIR);
        fileName = tmpDir.GetFilename() + "/weight.wt";
    }
    ML_ASSERT_THROWS_WITH_MESSAGE(FileWriter(fileName, /* truncateFile */ true), std::runtime_error, "Unable to open");

    return 0;
}